

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_rust.cpp
# Opt level: O2

void __thiscall flatbuffers::rust::RustGenerator::~RustGenerator(RustGenerator *this)

{
  (this->super_BaseGenerator)._vptr_BaseGenerator = (_func_int **)&PTR_generate_002fadc0;
  Namer::~Namer(&(this->namer_).super_Namer);
  CodeWriter::~CodeWriter(&this->code_);
  BaseGenerator::~BaseGenerator(&this->super_BaseGenerator);
  return;
}

Assistant:

RustGenerator(const Parser &parser, const std::string &path,
                const std::string &file_name)
      : BaseGenerator(parser, path, file_name, "", "::", "rs"),
        cur_name_space_(nullptr),
        namer_(WithFlagOptions(RustDefaultConfig(), parser.opts, path),
               RustKeywords()) {
    // TODO: Namer flag overrides should be in flatc or flatc_main.
    code_.SetPadding("  ");
  }